

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O2

int64_t lj_carith_powi64(int64_t x,int64_t k)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 1;
  if (k != 0) {
    if (-1 < k) {
      if (k == 0) {
        return 1;
      }
      for (; (k & 1U) == 0; k = (ulong)k >> 1) {
        x = x * x;
      }
      if (1 < (ulong)k) {
        lVar1 = x;
        while( true ) {
          x = x * x;
          if ((ulong)k >> 1 == 1) break;
          lVar2 = x;
          if ((k & 2U) == 0) {
            lVar2 = 1;
          }
          lVar1 = lVar1 * lVar2;
          k = (ulong)k >> 1;
        }
        x = x * lVar1;
      }
      return x;
    }
    if (x == -1) {
      uVar3 = -(ulong)((uint)k & 1) | 1;
    }
    else {
      if (x == 0) {
        return 0x7fffffffffffffff;
      }
      if (x != 1) {
        return 0;
      }
    }
  }
  return uVar3;
}

Assistant:

int64_t lj_carith_powi64(int64_t x, int64_t k)
{
  if (k == 0)
    return 1;
  if (k < 0) {
    if (x == 0)
      return U64x(7fffffff,ffffffff);
    else if (x == 1)
      return 1;
    else if (x == -1)
      return (k & 1) ? -1 : 1;
    else
      return 0;
  }
  return (int64_t)lj_carith_powu64((uint64_t)x, (uint64_t)k);
}